

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  undefined8 uVar5;
  seqStore_t *psVar6;
  int *piVar7;
  U32 lowestValid;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  seqDef *psVar12;
  BYTE *litEnd;
  ZSTD_matchState_t *pZVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int *piVar17;
  int *piVar18;
  BYTE *litLimit_w_1;
  ulong uVar19;
  U32 UVar20;
  ulong uVar21;
  long lVar22;
  size_t offbaseFound;
  ZSTD_matchState_t *local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  int *local_70;
  int *local_68;
  seqStore_t *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  BYTE *litLimit_w;
  BYTE *local_40;
  U32 *local_38;
  
  pBVar2 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  local_40 = pBVar2 + uVar8;
  uVar15 = (ms->cParams).minMatch;
  uVar14 = 6;
  if (uVar15 < 6) {
    uVar14 = uVar15;
  }
  local_74 = 4;
  if (4 < uVar14) {
    local_74 = uVar14;
  }
  local_4c = *rep;
  piVar17 = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  iVar16 = (int)piVar17 - (int)pBVar2;
  uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_50 = iVar16 - uVar15;
  if (iVar16 - uVar8 <= uVar15) {
    local_50 = uVar8;
  }
  if (ms->loadedDictEnd != 0) {
    local_50 = uVar8;
  }
  local_54 = rep[1];
  local_50 = iVar16 - local_50;
  uVar8 = local_54;
  if (local_50 < local_54) {
    uVar8 = 0;
  }
  uVar15 = local_4c;
  if (local_50 < local_4c) {
    uVar15 = 0;
  }
  uVar21 = (ulong)uVar15;
  ms->lazySkipping = 0;
  pBVar2 = (BYTE *)((long)src + srcSize);
  local_68 = (int *)((long)src + (srcSize - 8));
  litLimit_w = (BYTE *)((long)src + (srcSize - 0x20));
  local_88 = ms;
  local_60 = seqStore;
  local_38 = rep;
  do {
    local_7c = uVar8;
    pZVar13 = local_88;
    local_78 = (uint)uVar21;
    lVar22 = -uVar21;
    while( true ) {
      UVar20 = (U32)uVar21;
      if (local_68 <= piVar17) {
        if (local_54 <= local_50) {
          local_54 = 0;
        }
        uVar8 = local_54;
        if (UVar20 != 0) {
          uVar8 = local_4c;
        }
        if (local_4c <= local_50) {
          uVar8 = local_54;
          local_4c = 0;
        }
        if (UVar20 != 0) {
          local_4c = UVar20;
        }
        if (local_7c != 0) {
          uVar8 = local_7c;
        }
        *local_38 = local_4c;
        local_38[1] = uVar8;
        return (long)pBVar2 - (long)src;
      }
      if (UVar20 == 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = 0;
        if (*(int *)((long)piVar17 + lVar22 + 1) == *(int *)((long)piVar17 + 1)) {
          sVar9 = ZSTD_count((BYTE *)((long)piVar17 + 5),(BYTE *)((long)piVar17 + lVar22 + 5),pBVar2
                            );
          uVar21 = sVar9 + 4;
        }
      }
      offbaseFound = 999999999;
      if (local_74 == 6) {
        uVar10 = ZSTD_BtFindBestMatch_noDict_6(pZVar13,(BYTE *)piVar17,pBVar2,&offbaseFound);
      }
      else if (local_74 == 5) {
        uVar10 = ZSTD_BtFindBestMatch_noDict_5(pZVar13,(BYTE *)piVar17,pBVar2,&offbaseFound);
      }
      else {
        uVar10 = ZSTD_BtFindBestMatch_noDict_4(pZVar13,(BYTE *)piVar17,pBVar2,&offbaseFound);
      }
      uVar11 = uVar21;
      if (uVar21 < uVar10) {
        uVar11 = uVar10;
      }
      if (3 < uVar11) break;
      uVar21 = (long)piVar17 - (long)src;
      piVar17 = (int *)((long)piVar17 + (uVar21 >> 8) + 1);
      pZVar13->lazySkipping = (uint)(0x7ff < uVar21);
      uVar21 = (ulong)local_78;
    }
    uVar19 = offbaseFound;
    if (uVar10 <= uVar21) {
      uVar19 = 1;
    }
    piVar7 = (int *)((long)piVar17 + 1);
    if (uVar21 < uVar10) {
      piVar7 = piVar17;
    }
LAB_01bbeca7:
    do {
      local_70 = piVar7;
      uVar10 = uVar11;
      uVar21 = uVar19;
      piVar18 = piVar17;
      if (local_68 <= piVar18) break;
      piVar17 = (int *)((long)piVar18 + 1);
      if (uVar21 == 0) {
        uVar21 = 0;
      }
      else if ((local_78 != 0) && (*piVar17 == *(int *)((long)piVar17 + lVar22))) {
        sVar9 = ZSTD_count((BYTE *)((long)piVar18 + 5),(BYTE *)((long)piVar18 + lVar22 + 5),pBVar2);
        if (sVar9 < 0xfffffffffffffffc) {
          uVar8 = 0x1f;
          if ((uint)uVar21 != 0) {
            for (; (uint)uVar21 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          if ((int)((uVar8 ^ 0x1f) + (int)uVar10 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
            uVar21 = 1;
            uVar10 = sVar9 + 4;
            local_70 = piVar17;
          }
        }
      }
      offbaseFound = 999999999;
      if (local_74 == 6) {
        uVar11 = ZSTD_BtFindBestMatch_noDict_6(local_88,(BYTE *)piVar17,pBVar2,&offbaseFound);
      }
      else if (local_74 == 5) {
        uVar11 = ZSTD_BtFindBestMatch_noDict_5(local_88,(BYTE *)piVar17,pBVar2,&offbaseFound);
      }
      else {
        uVar11 = ZSTD_BtFindBestMatch_noDict_4(local_88,(BYTE *)piVar17,pBVar2,&offbaseFound);
      }
      uVar8 = (uint)uVar21;
      pZVar13 = local_88;
      if (3 < uVar11) {
        uVar15 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        iVar16 = 0x1f;
        if ((uint)offbaseFound != 0) {
          for (; (uint)offbaseFound >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        uVar19 = offbaseFound;
        piVar7 = piVar17;
        if ((int)((uVar15 ^ 0x1f) + (int)uVar10 * 4 + -0x1b) < (int)uVar11 * 4 - iVar16)
        goto LAB_01bbeca7;
      }
      if (local_68 <= piVar17) break;
      piVar17 = (int *)((long)piVar18 + 2);
      if (uVar21 == 0) {
        uVar21 = 0;
      }
      else if ((local_78 != 0) && (*piVar17 == *(int *)((long)piVar17 + lVar22))) {
        sVar9 = ZSTD_count((BYTE *)((long)piVar18 + 6),(BYTE *)((long)piVar18 + lVar22 + 6),pBVar2);
        if (sVar9 < 0xfffffffffffffffc) {
          uVar15 = 0x1f;
          if (uVar8 != 0) {
            for (; uVar8 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          if ((int)((uVar15 ^ 0x1f) + (int)uVar10 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
            uVar21 = 1;
            uVar10 = sVar9 + 4;
            local_70 = piVar17;
          }
        }
      }
      offbaseFound = 999999999;
      if (local_74 == 6) {
        uVar11 = ZSTD_BtFindBestMatch_noDict_6(local_88,(BYTE *)piVar17,pBVar2,&offbaseFound);
      }
      else if (local_74 == 5) {
        uVar11 = ZSTD_BtFindBestMatch_noDict_5(local_88,(BYTE *)piVar17,pBVar2,&offbaseFound);
      }
      else {
        uVar11 = ZSTD_BtFindBestMatch_noDict_4(local_88,(BYTE *)piVar17,pBVar2,&offbaseFound);
      }
      pZVar13 = local_88;
      if (uVar11 < 4) break;
      uVar8 = 0x1f;
      if ((uint)uVar21 != 0) {
        for (; (uint)uVar21 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      iVar16 = 0x1f;
      if ((uint)offbaseFound != 0) {
        for (; (uint)offbaseFound >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      uVar19 = offbaseFound;
      piVar7 = piVar17;
    } while ((int)((uVar8 ^ 0x1f) + (int)uVar10 * 4 + -0x18) < (int)uVar11 * 4 - iVar16);
    piVar17 = local_70;
    if (3 < uVar21) {
      for (; ((src < piVar17 && (local_40 < (BYTE *)((long)piVar17 + (3 - uVar21)))) &&
             (*(BYTE *)((long)piVar17 + -1) == *(BYTE *)((long)piVar17 + (2 - uVar21))));
          piVar17 = (int *)((long)piVar17 + -1)) {
        uVar10 = uVar10 + 1;
      }
      local_7c = local_78;
      local_78 = (U32)uVar21 - 3;
    }
    uVar11 = (long)piVar17 - (long)src;
    pBVar3 = local_60->lit;
    if (litLimit_w < piVar17) {
      ZSTD_safecopyLiterals(pBVar3,(BYTE *)src,(BYTE *)piVar17,litLimit_w);
LAB_01bbef1d:
      local_60->lit = local_60->lit + uVar11;
      psVar12 = local_60->sequences;
      if (0xffff < uVar11) {
        local_60->longLengthType = ZSTD_llt_literalLength;
        local_60->longLengthPos =
             (U32)((ulong)((long)psVar12 - (long)local_60->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar3 = *src;
      *(undefined8 *)(pBVar3 + 8) = uVar5;
      pBVar3 = local_60->lit;
      if (0x10 < uVar11) {
        uVar5 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar3 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar3 + 0x18) = uVar5;
        if (0x20 < (long)uVar11) {
          lVar22 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar22 + 0x20);
            uVar5 = puVar1[1];
            pBVar4 = pBVar3 + lVar22 + 0x20;
            *(undefined8 *)pBVar4 = *puVar1;
            *(undefined8 *)(pBVar4 + 8) = uVar5;
            puVar1 = (undefined8 *)((long)src + lVar22 + 0x30);
            uVar5 = puVar1[1];
            *(undefined8 *)(pBVar4 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar4 + 0x18) = uVar5;
            lVar22 = lVar22 + 0x20;
          } while (pBVar4 + 0x20 < pBVar3 + uVar11);
        }
        goto LAB_01bbef1d;
      }
      local_60->lit = pBVar3 + uVar11;
      psVar12 = local_60->sequences;
    }
    pBVar3 = litLimit_w;
    psVar6 = local_60;
    psVar12->litLength = (U16)uVar11;
    psVar12->offBase = (U32)uVar21;
    if (0xffff < uVar10 - 3) {
      local_60->longLengthType = ZSTD_llt_matchLength;
      local_60->longLengthPos = (U32)((ulong)((long)psVar12 - (long)local_60->sequencesStart) >> 3);
    }
    psVar12->mlBase = (U16)(uVar10 - 3);
    local_60->sequences = psVar12 + 1;
    if (pZVar13->lazySkipping != 0) {
      pZVar13->lazySkipping = 0;
    }
    src = (void *)((long)piVar17 + uVar10);
    uVar10 = (ulong)local_7c;
    uVar21 = (ulong)local_78;
    for (; ((uVar11 = uVar10, uVar8 = (uint)uVar11, piVar17 = (int *)src, uVar8 != 0 &&
            (src <= local_68)) && (*src == *(int *)((long)src - uVar11)));
        src = (void *)((long)src + sVar9 + 4)) {
      sVar9 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar11)),pBVar2);
      pBVar4 = psVar6->lit;
      if (pBVar3 < src) {
        ZSTD_safecopyLiterals(pBVar4,(BYTE *)src,(BYTE *)src,pBVar3);
      }
      else {
        uVar5 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar4 = *src;
        *(undefined8 *)(pBVar4 + 8) = uVar5;
      }
      psVar12 = psVar6->sequences;
      psVar12->litLength = 0;
      psVar12->offBase = 1;
      if (0xffff < sVar9 + 1) {
        psVar6->longLengthType = ZSTD_llt_matchLength;
        psVar6->longLengthPos = (U32)((ulong)((long)psVar12 - (long)psVar6->sequencesStart) >> 3);
      }
      psVar12->mlBase = (U16)(sVar9 + 1);
      psVar6->sequences = psVar12 + 1;
      uVar10 = uVar21;
      uVar21 = uVar11;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}